

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  CodeHolder *this_00;
  Section *pSVar1;
  ulong uVar2;
  Logger *pLVar3;
  Error EVar4;
  ulong uVar5;
  undefined1 *puVar6;
  uint8_t *__dest;
  Error unaff_R13D;
  StringTmp<512UL> sb;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *puStack_240;
  undefined1 local_238 [520];
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
    return EVar4;
  }
  if (dataSize == 0) {
    EVar4 = 0;
  }
  else {
    __dest = this->_bufferPtr;
    EVar4 = 0;
    if ((ulong)((long)this->_bufferEnd - (long)__dest) < dataSize) {
      unaff_R13D = CodeHolder::growBuffer(this_00,&this->_section->_buffer,dataSize);
      if (unaff_R13D != 0) goto LAB_001158bf;
      __dest = this->_bufferPtr;
      EVar4 = 0;
      goto LAB_001158ae;
    }
    while (EVar4 == 0) {
      memcpy(__dest,data,dataSize);
      __dest = __dest + dataSize;
      pSVar1 = this->_section;
      uVar5 = (long)__dest - (long)this->_bufferData;
      if (uVar5 <= (pSVar1->_buffer)._capacity) {
        this->_bufferPtr = __dest;
        uVar2 = (pSVar1->_buffer)._size;
        if (uVar5 < uVar2) {
          uVar5 = uVar2;
        }
        (pSVar1->_buffer)._size = uVar5;
        pLVar3 = (this->super_BaseEmitter)._logger;
        if (pLVar3 == (Logger *)0x0) {
          return 0;
        }
        puStack_240 = local_238;
        uStack_250 = 0;
        local_258 = 0x20;
        local_248 = 0x207;
        local_238[0] = 0;
        Formatter::formatData
                  ((String *)&local_258,(pLVar3->_options)._flags,
                   (this->super_BaseEmitter)._environment._arch,kUInt8,data,dataSize,1);
        String::_opChar((String *)&local_258,kAppend,'\n');
        pLVar3 = (this->super_BaseEmitter)._logger;
        uVar5 = uStack_250;
        puVar6 = puStack_240;
        if ((local_258 & 0xff) < 0x1f) {
          uVar5 = local_258 & 0xff;
          puVar6 = (undefined1 *)((long)&local_258 + 1);
        }
        (*pLVar3->_vptr_Logger[2])(pLVar3,puVar6,uVar5);
        String::reset((String *)&local_258);
        return 0;
      }
      embed();
LAB_001158bf:
      EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,unaff_R13D,(char *)0x0);
LAB_001158ae:
      if (unaff_R13D == 0) {
        EVar4 = 0;
      }
    }
  }
  return EVar4;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), TypeId::kUInt8, data, dataSize, 1);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}